

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-readable-nor-writable-on-read-error.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  ssize_t *psVar2;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_18;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      local_18 = nread;
      if (nread != -0xfff) goto LAB_001d1c11;
      puts("GOT EOF");
      uv_close(tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001d1c11:
  psVar2 = &local_18;
  read_cb_cold_1();
  if (psVar2 != (ssize_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(psVar2,0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf) {
  read_cb_called++;

  ASSERT((nread < 0) && (nread != UV_EOF));
  ASSERT_OK(uv_is_writable(handle));
  ASSERT_OK(uv_is_readable(handle));

  uv_close((uv_handle_t*) handle, close_cb);
}